

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void function_statement(ch_compilation *comp)

{
  uint8_t last_scope_size;
  uint8_t scope_mark;
  ch_token_kind kind;
  ch_compilation *comp_local;
  
  switch((comp->current).kind) {
  case TK_VAL:
    advance(comp);
    declaration(comp);
    semicolon(comp);
    break;
  default:
    error(comp,"Expected statement.");
    break;
  case TK_POUND:
    function(comp);
    break;
  case TK_COPEN:
    last_scope_size = begin_scope(comp);
    scope(comp);
    end_scope(comp,last_scope_size);
    break;
  case TK_ID:
    statement_identifier(comp);
    semicolon(comp);
    break;
  case TK_RETURN:
    return_statement(comp);
    semicolon(comp);
    break;
  case TK_IF:
    if_statement(comp);
    break;
  case TK_WHILE:
    while_statement(comp);
    break;
  case TK_FOR:
    for_statement(comp);
    break;
  case TK_DO:
    do_while_statement(comp);
    opt_consume(comp,TK_SEMI,(ch_token *)0x0);
  }
  if ((comp->is_panic & 1U) != 0) {
    synchronize_in_function(comp);
  }
  return;
}

Assistant:

void function_statement(ch_compilation *comp) {
  ch_token_kind kind = comp->current.kind;

  switch (comp->current.kind) {
  case TK_VAL: {
    advance(comp);
    declaration(comp);
    semicolon(comp);
    break;
  }
  case TK_COPEN: {
    uint8_t scope_mark = begin_scope(comp);
    scope(comp);
    end_scope(comp, scope_mark);
    break;
  }
  case TK_RETURN: {
    return_statement(comp);
    semicolon(comp);
    break;
  }
  case TK_POUND: {
    function(comp);
    break;
  }
  case TK_ID: {
    statement_identifier(comp);
    semicolon(comp);
    break;
  }
  case TK_IF: {
    if_statement(comp);
    break;
  }
  case TK_WHILE: {
    while_statement(comp);
    break;
  }
  case TK_DO: {
    do_while_statement(comp);
    opt_consume(comp, TK_SEMI, NULL);
    break;
  }
  case TK_FOR: {
    for_statement(comp);
    break;
  }
  default:
    error(comp, "Expected statement.");
  }

  if (comp->is_panic)
    synchronize_in_function(comp);
}